

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O0

bool __thiscall QSplitter::event(QSplitter *this,QEvent *e)

{
  bool bVar1;
  Type TVar2;
  QSplitterPrivate *pQVar3;
  QEvent *in_RSI;
  QEvent *in_RDI;
  QSplitterPrivate *d;
  bool in_stack_0000003f;
  QSplitterPrivate *in_stack_00000040;
  undefined4 in_stack_ffffffffffffffe0;
  
  pQVar3 = d_func((QSplitter *)0x69d1f1);
  TVar2 = QEvent::type(in_RSI);
  if (TVar2 == Show) {
    if ((*(uint *)&pQVar3->field_0x2a4 >> 8 & 1) == 0) goto LAB_0069d2cb;
    *(uint *)&pQVar3->field_0x2a4 = *(uint *)&pQVar3->field_0x2a4 & 0xffff00ff;
  }
  else {
    if (TVar2 == Hide) {
      if ((*(uint *)&pQVar3->field_0x2a4 >> 8 & 1) == 0) {
        *(uint *)&pQVar3->field_0x2a4 = *(uint *)&pQVar3->field_0x2a4 & 0xffff00ff | 0x100;
      }
      goto LAB_0069d2cb;
    }
    if ((1 < TVar2 - ShowToParent) && (TVar2 != LayoutRequest)) goto LAB_0069d2cb;
  }
  QWidget::isVisible((QWidget *)0x69d2b7);
  QSplitterPrivate::recalc(in_stack_00000040,in_stack_0000003f);
LAB_0069d2cb:
  bVar1 = QFrame::event((QFrame *)CONCAT44(TVar2,in_stack_ffffffffffffffe0),in_RDI);
  return bVar1;
}

Assistant:

bool QSplitter::event(QEvent *e)
{
    Q_D(QSplitter);
    switch (e->type()) {
    case QEvent::Hide:
        // Reset firstShow to false here since things can be done to the splitter in between
        if (!d->firstShow)
            d->firstShow = true;
        break;
    case QEvent::Show:
        if (!d->firstShow)
            break;
        d->firstShow = false;
        Q_FALLTHROUGH();
    case QEvent::HideToParent:
    case QEvent::ShowToParent:
    case QEvent::LayoutRequest:
        d->recalc(isVisible());
        break;
    default:
        ;
    }
    return QFrame::event(e);
}